

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_writers.h
# Opt level: O2

ssize_t __thiscall cppwinrt::writer::write(writer *this,int __fd,void *__buf,size_t __n)

{
  ssize_t extraout_RAX;
  ssize_t sVar1;
  undefined4 in_register_00000034;
  char *pcVar2;
  string_view local_10;
  
  pcVar2 = (char *)CONCAT44(in_register_00000034,__fd);
  if ((this->abi_types == false) && (*pcVar2 == '\x01')) {
    local_10._M_len = 0xc;
    local_10._M_str = "com_array<%>";
    writer_base<cppwinrt::writer>::
    write_segment<std::variant<winmd::reader::ElementType,winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,winmd::reader::GenericTypeIndex,winmd::reader::GenericTypeInstSig,winmd::reader::GenericMethodTypeIndex>>
              (&this->super_writer_base<cppwinrt::writer>,&local_10,
               (variant<winmd::reader::ElementType,_winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,_winmd::reader::GenericTypeIndex,_winmd::reader::GenericTypeInstSig,_winmd::reader::GenericMethodTypeIndex>
                *)(pcVar2 + 0x28));
    return extraout_RAX;
  }
  sVar1 = write(this,(int)(pcVar2 + 0x28),pcVar2 + 0x28,__n);
  return sVar1;
}

Assistant:

void write(TypeSig const& signature)
        {
            if (!abi_types && signature.is_szarray())
            {
                write("com_array<%>", signature.Type());
            }
            else
            {
                write(signature.Type());
            }
        }